

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsDataCollectionAddField(FmsDataCollection dc,char *field_name,FmsField *field)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  FmsField *ppFVar4;
  FmsField __ptr;
  char *pcVar5;
  int iVar6;
  
  if (dc == (FmsDataCollection)0x0) {
    return 1;
  }
  if (field == (FmsField *)0x0) {
    return 2;
  }
  uVar1 = dc->num_fields;
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar3 < uVar1 + 1);
  if (uVar3 >> 1 < uVar1) {
LAB_0010847d:
    __ptr = (FmsField)calloc(1,0x30);
    if (__ptr == (FmsField)0x0) {
      return 3;
    }
    iVar6 = 0;
    if (field_name == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = strdup(field_name);
      if (pcVar5 == (char *)0x0) {
        free(__ptr);
        goto LAB_001084bb;
      }
    }
    __ptr->name = pcVar5;
    dc->num_fields = uVar1 + 1;
    dc->fields[uVar1] = __ptr;
    *field = __ptr;
  }
  else {
    ppFVar4 = (FmsField *)realloc(dc->fields,uVar3 << 3);
    if (ppFVar4 != (FmsField *)0x0) {
      dc->fields = ppFVar4;
      goto LAB_0010847d;
    }
LAB_001084bb:
    iVar6 = 3;
  }
  return iVar6;
}

Assistant:

int FmsDataCollectionAddField(FmsDataCollection dc, const char *field_name,
                              FmsField *field) {
  if (!dc) { E_RETURN(1); }
  if (!field) { E_RETURN(2); }
  const FmsInt num_fields = dc->num_fields;
  FmsField *fields = dc->fields;
  // Reallocate dc->fields, if necessary
  const FmsInt nc = NextPow2(num_fields + 1);
  if (num_fields <= nc/2) {
    fields = realloc(fields, nc*sizeof(*fields));
    if (fields == NULL) { E_RETURN(3); }
    dc->fields = fields;
  }
  FmsField new_field;
  new_field = calloc(1, sizeof(*new_field));
  if (new_field == NULL) { E_RETURN(3); }
  // On error, call free(new_field)
  if (FmsCopyString(field_name, &new_field->name)) {
    free(new_field); E_RETURN(3);
  }
  // Update the field
  dc->num_fields = num_fields + 1;
  dc->fields[num_fields] = new_field;
  *field = new_field;
  return 0;
}